

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::GeneratedClassNameImpl_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,ServiceDescriptor *desc)

{
  string *psVar1;
  string classname;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,*(string **)(this + 8));
  psVar1 = (string *)
           (*(ulong *)(*(long *)(*(FileDescriptor **)(this + 0x10) + 0x78) + 0x78) &
           0xfffffffffffffffe);
  if (*(long *)(psVar1 + 8) == 0) {
    anon_unknown_2::ReservedNamePrefix(&local_50,&local_30,*(FileDescriptor **)(this + 0x10));
  }
  else {
    std::__cxx11::string::string((string *)&local_50,psVar1);
  }
  std::operator+(__return_storage_ptr__,&local_50,&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratedClassNameImpl(const ServiceDescriptor* desc) {
  std::string classname = desc->name();
  return ClassNamePrefix(classname, desc) + classname;
}